

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createFractionalSpacingTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"fractional_spacing","Test fractional spacing modes");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"odd",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCaseWithPrograms<vkt::tessellation::SpacingMode>
            (pTVar1,&local_40,&local_60,anon_unknown_0::initPrograms,anon_unknown_0::test,
             SPACINGMODE_FRACTIONAL_ODD);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"even",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCaseWithPrograms<vkt::tessellation::SpacingMode>
            (pTVar1,&local_40,&local_60,anon_unknown_0::initPrograms,anon_unknown_0::test,
             SPACINGMODE_FRACTIONAL_EVEN);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createFractionalSpacingTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "fractional_spacing", "Test fractional spacing modes"));

	addFunctionCaseWithPrograms(group.get(), "odd",  "", initPrograms, test, SPACINGMODE_FRACTIONAL_ODD);
	addFunctionCaseWithPrograms(group.get(), "even", "", initPrograms, test, SPACINGMODE_FRACTIONAL_EVEN);

	return group.release();
}